

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

void __thiscall lts2::LBDOperator::drawSelfAsCircles(LBDOperator *this,Mat *destImage)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _InputArray *p_Var5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  IntegratingCell *pIVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  int local_1cc;
  int local_1c8;
  Point_<int> local_198;
  _InputOutputArray local_190;
  Point_<int> local_178;
  _InputOutputArray local_170;
  Point_<int> local_158;
  _InputOutputArray local_150;
  Point_<int> local_138;
  _InputOutputArray local_130;
  undefined8 local_118;
  IntegratingCell minus;
  IntegratingCell plus;
  float n_ymax;
  float n_ymin;
  float n_xmax;
  float n_xmin;
  int ymax;
  int ymin;
  int xmax;
  int xmin;
  int radius;
  Point center;
  int i;
  Scalar black;
  Scalar red;
  Scalar_<double> local_68;
  _InputArray local_48;
  Size_<int> local_30;
  Size_<int> local_28;
  Size_<int> local_20;
  _InputArray *local_18;
  Mat *destImage_local;
  LBDOperator *this_local;
  
  local_18 = (_InputArray *)destImage;
  destImage_local = (Mat *)this;
  cv::MatSize::operator()((MatSize *)&local_20);
  cv::Size_<int>::Size_(&local_28,0,0);
  bVar6 = cv::operator==(&local_20,&local_28);
  p_Var5 = local_18;
  if (bVar6) {
    cv::Size_<int>::Size_(&local_30,&this->_patchSize);
    cv::Mat::create(p_Var5,&local_30,0x10);
  }
  p_Var5 = local_18;
  cv::Scalar_<double>::all(&local_68,255.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_48,(Matx<double,_4,_1> *)&local_68);
  cv::noArray();
  cv::Mat::setTo(p_Var5,&local_48);
  cv::_InputArray::~_InputArray(&local_48);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)(black.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3),0.0,
             0.0,255.0,0.0);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&center.y,0.0,0.0,0.0,0.0);
  for (center.x = 0; iVar9 = center.x, uVar7 = pairs(this), (uint)iVar9 < uVar7;
      center.x = center.x + 1) {
    cv::Point_<int>::Point_((Point_<int> *)&xmin);
    pIVar12 = this->_sensitiveCells + this->_basisFunctions[center.x].pos_cell;
    dVar14 = *(double *)pIVar12;
    uVar3 = pIVar12->ymin;
    uVar4 = pIVar12->ymax;
    pIVar12 = this->_sensitiveCells + this->_basisFunctions[center.x].neg_cell;
    local_118._0_4_ = pIVar12->xmin;
    local_118._4_4_ = pIVar12->xmax;
    minus.xmin = pIVar12->ymin;
    minus.xmax = pIVar12->ymax;
    minus._8_8_ = pIVar12->scaleFactor;
    minus.scaleFactor._0_4_ = SUB84(dVar14,0);
    fVar13 = (float)minus.scaleFactor._0_4_;
    minus.scaleFactor._4_4_ = (int)((ulong)dVar14 >> 0x20);
    iVar10 = minus.scaleFactor._4_4_ + -1;
    iVar9 = (this->_patchSize).width;
    iVar1 = (this->_patchSize).height;
    iVar2 = (this->_patchSize).height;
    minus.scaleFactor = dVar14;
    dVar14 = rint((double)((fVar13 / (float)(this->_patchSize).width) *
                          (float)*(int *)((long)&local_18->obj + 4)));
    iVar8 = (int)dVar14;
    dVar14 = rint((double)(((float)iVar10 / (float)iVar9) *
                          (float)*(int *)((long)&local_18->obj + 4)));
    dVar15 = rint((double)(((float)(int)uVar3 / (float)iVar1) * (float)*(int *)&local_18->obj));
    iVar9 = (int)dVar15;
    dVar15 = rint((double)(((float)(uVar4 + -1) / (float)iVar2) * (float)*(int *)&local_18->obj));
    if ((int)dVar14 - iVar8 < (int)dVar15 - iVar9) {
      local_1c8 = (int)dVar14 - iVar8;
    }
    else {
      local_1c8 = (int)dVar15 - iVar9;
    }
    local_1c8 = local_1c8 / 2;
    xmin = iVar8 + local_1c8;
    radius = iVar9 + local_1c8;
    cv::_InputOutputArray::_InputOutputArray(&local_130,(Mat *)local_18);
    cv::Point_<int>::Point_(&local_138,(Point_<int> *)&xmin);
    cv::circle(&local_130,&local_138,local_1c8,
               black.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_130);
    cv::_InputOutputArray::_InputOutputArray(&local_150,(Mat *)local_18);
    cv::Point_<int>::Point_(&local_158,(Point_<int> *)&xmin);
    cv::circle(&local_150,&local_158,1,&center.y,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_150);
    iVar10 = local_118._4_4_ + -1;
    iVar9 = (this->_patchSize).width;
    fVar13 = (float)minus.xmin;
    iVar1 = (this->_patchSize).height;
    iVar11 = minus.xmax + -1;
    iVar2 = (this->_patchSize).height;
    dVar14 = rint((double)(((float)(int)local_118 / (float)(this->_patchSize).width) *
                          (float)*(int *)((long)&local_18->obj + 4)));
    iVar8 = (int)dVar14;
    dVar14 = rint((double)(((float)iVar10 / (float)iVar9) *
                          (float)*(int *)((long)&local_18->obj + 4)));
    dVar15 = rint((double)((fVar13 / (float)iVar1) * (float)*(int *)&local_18->obj));
    iVar9 = (int)dVar15;
    dVar15 = rint((double)(((float)iVar11 / (float)iVar2) * (float)*(int *)&local_18->obj));
    if ((int)dVar14 - iVar8 < (int)dVar15 - iVar9) {
      local_1cc = (int)dVar14 - iVar8;
    }
    else {
      local_1cc = (int)dVar15 - iVar9;
    }
    local_1cc = local_1cc / 2;
    xmin = iVar8 + local_1cc;
    radius = iVar9 + local_1cc;
    cv::_InputOutputArray::_InputOutputArray(&local_170,(Mat *)local_18);
    cv::Point_<int>::Point_(&local_178,(Point_<int> *)&xmin);
    cv::circle(&local_170,&local_178,local_1cc,
               black.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_170);
    cv::_InputOutputArray::_InputOutputArray(&local_190,(Mat *)local_18);
    cv::Point_<int>::Point_(&local_198,(Point_<int> *)&xmin);
    cv::circle(&local_190,&local_198,1,&center.y,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_190);
  }
  return;
}

Assistant:

void lts2::LBDOperator::drawSelfAsCircles(cv::Mat &destImage) const
{
  if (destImage.size() == cv::Size(0,0))
    destImage.create(_patchSize, CV_8UC3);
  
  // Fill with white
  destImage.setTo(cv::Scalar::all(255));

  // Shortcuts
  cv::Scalar red = cv::Scalar(0, 0, 255);
  cv::Scalar black = cv::Scalar(0, 0, 0);

  // Loop over the cells
  for (int i = 0; i < this->pairs(); ++i)
  {
    cv::Point center;
    int radius, xmin, xmax, ymin, ymax;
    float n_xmin, n_xmax, n_ymin, n_ymax;

    lbd::IntegratingCell plus = _sensitiveCells[_basisFunctions[i].pos_cell];
    lbd::IntegratingCell minus = _sensitiveCells[_basisFunctions[i].neg_cell];

    // (+) first
    n_xmin = plus.xmin / (float)_patchSize.width;
    n_xmax = (plus.xmax-1) / (float)_patchSize.width;
    n_ymin = plus.ymin / (float)_patchSize.height;
    n_ymax = (plus.ymax -1)/ (float)_patchSize.height;

    xmin = rint(n_xmin * destImage.cols);
    xmax = rint(n_xmax * destImage.cols);
    ymin = rint(n_ymin * destImage.rows);
    ymax = rint(n_ymax * destImage.rows);

    radius = MIN(ymax-ymin,xmax-xmin) / 2;
    center.x = xmin + radius;
    center.y = ymin + radius;

    cv::circle(destImage, center, radius, red);
    cv::circle(destImage, center, 1, black, -1);

    // (-) now
    n_xmin = minus.xmin / (float)_patchSize.width;
    n_xmax = (minus.xmax-1) / (float)_patchSize.width;
    n_ymin = minus.ymin / (float)_patchSize.height;
    n_ymax = (minus.ymax -1)/ (float)_patchSize.height;

    xmin = rint(n_xmin * destImage.cols);
    xmax = rint(n_xmax * destImage.cols);
    ymin = rint(n_ymin * destImage.rows);
    ymax = rint(n_ymax * destImage.rows);

    radius = MIN(ymax-ymin,xmax-xmin) / 2;
    center.x = xmin + radius;
    center.y = ymin + radius;

    cv::circle(destImage, center, radius, red);
    cv::circle(destImage, center, 1, black, -1);
  }
}